

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_tests.cpp
# Opt level: O0

void __thiscall i2p_tests::damaged_private_key::test_method(damaged_private_key *this)

{
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  CService *to;
  Connection *conn_00;
  __tuple_element_t<1UL,_tuple<basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  *proxy_error_00;
  string *message;
  long in_FS_OFFSET;
  type *expected_error;
  type *file_contents;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  bool proxy_error;
  iterator __end1;
  iterator __begin1;
  Connection conn;
  DebugLogHelper debugloghelper28;
  DebugLogHelper debugloghelper27;
  Session session;
  Proxy sam_proxy;
  CService addr;
  CThreadInterrupt interrupt;
  path i2p_private_key_file;
  CThreadInterrupt *in_stack_fffffffffffff738;
  undefined7 in_stack_fffffffffffff740;
  undefined1 in_stack_fffffffffffff747;
  undefined7 in_stack_fffffffffffff748;
  char in_stack_fffffffffffff74f;
  undefined7 in_stack_fffffffffffff750;
  undefined1 in_stack_fffffffffffff757;
  string *in_stack_fffffffffffff758;
  undefined7 in_stack_fffffffffffff760;
  undefined1 in_stack_fffffffffffff767;
  Connection *in_stack_fffffffffffff768;
  const_string *in_stack_fffffffffffff770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff778;
  CThreadInterrupt *in_stack_fffffffffffff780;
  undefined7 in_stack_fffffffffffff788;
  undefined1 in_stack_fffffffffffff78f;
  undefined7 in_stack_fffffffffffff798;
  undefined1 *local_820;
  undefined4 in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff84c;
  uint uVar4;
  const_string local_778 [2];
  lazy_ostream local_758 [2];
  const_string local_6f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  undefined1 local_6a9 [33];
  lazy_ostream local_688 [2];
  assertion_result local_668 [2];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_630;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_628;
  allocator<char> local_61b;
  allocator<char> local_61a;
  allocator<char> local_619 [745];
  undefined1 local_330;
  undefined1 local_32f;
  undefined1 local_32e;
  undefined1 local_32d;
  undefined1 local_32c;
  undefined1 local_32b;
  undefined1 local_32a;
  undefined1 local_329;
  undefined1 local_328;
  undefined1 local_327;
  undefined1 local_326;
  undefined1 local_325;
  undefined1 local_324;
  undefined1 local_323;
  undefined1 local_322;
  undefined1 local_321;
  undefined1 local_198 [320];
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::function<std::unique_ptr<Sock,std::default_delete<Sock>>(int,int,int)>::operator=
            ((function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)> *)
             CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
             (anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
  ArgsManager::GetDataDirNet
            ((ArgsManager *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
  fs::operator/((path *)CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                (char *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748));
  fs::path::~path((path *)in_stack_fffffffffffff738);
  uVar4 = CONCAT13(1,(int3)in_stack_fffffffffffff84c);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::tuple<const_char_(&)[1],_const_char_(&)[39],_true>
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
             (char (*) [1])CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
             (char (*) [39])in_stack_fffffffffffff738);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::tuple<const_char_(&)[5],_const_char_(&)[39],_true>
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
             (char (*) [5])CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
             (char (*) [39])in_stack_fffffffffffff738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff768,CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760)
             ,(char)((ulong)in_stack_fffffffffffff758 >> 0x38),
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750));
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[41],_true>
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
             (char (*) [41])in_stack_fffffffffffff738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff768,CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760)
             ,(char)((ulong)in_stack_fffffffffffff758 >> 0x38),
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                 in_stack_fffffffffffff74f);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                 in_stack_fffffffffffff74f);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[101],_true>
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
             (char (*) [101])in_stack_fffffffffffff738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff768,CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760)
             ,(char)((ulong)in_stack_fffffffffffff758 >> 0x38),
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                 in_stack_fffffffffffff74f);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                 in_stack_fffffffffffff74f);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                 (char *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748));
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[101],_true>
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
             (char (*) [101])in_stack_fffffffffffff738);
  uVar4 = uVar4 & 0xffffff;
  std::
  allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator((allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff738);
  __l._M_len._0_7_ = in_stack_fffffffffffff788;
  __l._M_array = (iterator)in_stack_fffffffffffff780;
  __l._M_len._7_1_ = in_stack_fffffffffffff78f;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)in_stack_fffffffffffff778,__l,(allocator_type *)in_stack_fffffffffffff770);
  std::
  allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff738);
  local_820 = local_58;
  do {
    local_820 = local_820 + -0x40;
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffff738);
  } while (local_820 != local_198);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738);
  std::allocator<char>::~allocator(&local_61b);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738);
  std::allocator<char>::~allocator(&local_61a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738);
  std::allocator<char>::~allocator(local_619);
  local_628 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
  local_630 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ((__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
                       (__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    to = (CService *)
         __gnu_cxx::
         __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::operator*((__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_stack_fffffffffffff738);
    conn_00 = (Connection *)
              std::get<0ul,std::__cxx11::string,std::__cxx11::string>
                        ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffff738);
    proxy_error_00 =
         std::get<1ul,std::__cxx11::string,std::__cxx11::string>
                   ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffff738);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
                 (pointer)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (unsigned_long)in_stack_fffffffffffff738);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff738);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff778,in_stack_fffffffffffff770,
                 (size_t)in_stack_fffffffffffff768,
                 (const_string *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760));
      uVar2 = WriteBinaryFile((path *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                              in_stack_fffffffffffff758);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
                 (bool)in_stack_fffffffffffff747);
      message = (string *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
                 (pointer)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (unsigned_long)in_stack_fffffffffffff738);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff738);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
                 (pointer)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (unsigned_long)in_stack_fffffffffffff738);
      in_stack_fffffffffffff738 = (CThreadInterrupt *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_668,local_688,(const_string *)(local_6a9 + 1),0x9c,REQUIRE,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff738);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff738);
      uVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)uVar3);
    CThreadInterrupt::CThreadInterrupt(in_stack_fffffffffffff738);
    local_330 = 0;
    local_32f = 0;
    local_32e = 0;
    local_32d = 0;
    local_32c = 0;
    local_32b = 0;
    local_32a = 0;
    local_329 = 0;
    local_328 = 0;
    local_327 = 0;
    local_326 = 0;
    local_325 = 0;
    local_324 = 0;
    local_323 = 0;
    local_322 = 0;
    local_321 = 1;
    CService::CService((CService *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
                       (in6_addr *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                       (uint16_t)((ulong)in_stack_fffffffffffff738 >> 0x30));
    Proxy::Proxy((Proxy *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
                 (CService *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 SUB81((ulong)in_stack_fffffffffffff738 >> 0x38,0));
    i2p::sam::Session::Session
              ((Session *)CONCAT17(uVar2,in_stack_fffffffffffff798),(path *)message,
               (Proxy *)CONCAT17(uVar3,in_stack_fffffffffffff788),in_stack_fffffffffffff780);
    in_stack_fffffffffffff780 = (CThreadInterrupt *)local_6a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar3,in_stack_fffffffffffff788),(char *)in_stack_fffffffffffff780,
               (allocator<char> *)in_stack_fffffffffffff778);
    in_stack_fffffffffffff778 = &local_6d0;
    std::function<bool(std::__cxx11::string_const*)>::
    function<DebugLogHelper::DebugLogHelper(std::__cxx11::string,std::function<bool(std::__cxx11::string_const*)>)::_default_arg_1_::_lambda(std::__cxx11::string_const*)_1_,void>
              ((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               (anon_class_1_0_00000001 *)
               CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
    DebugLogHelper::DebugLogHelper
              ((DebugLogHelper *)CONCAT17(uVar2,in_stack_fffffffffffff798),message,
               (MatchFn *)CONCAT17(uVar3,in_stack_fffffffffffff788));
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                 *)in_stack_fffffffffffff738);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff738);
    std::allocator<char>::~allocator((allocator<char> *)local_6a9);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    in_stack_fffffffffffff770 = local_6f8;
    std::function<bool(std::__cxx11::string_const*)>::
    function<DebugLogHelper::DebugLogHelper(std::__cxx11::string,std::function<bool(std::__cxx11::string_const*)>)::_default_arg_1_::_lambda(std::__cxx11::string_const*)_1_,void>
              ((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
               (anon_class_1_0_00000001 *)
               CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
    DebugLogHelper::DebugLogHelper
              ((DebugLogHelper *)CONCAT17(uVar2,in_stack_fffffffffffff798),message,
               (MatchFn *)CONCAT17(uVar3,in_stack_fffffffffffff788));
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                 *)in_stack_fffffffffffff738);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff738);
    i2p::Connection::Connection(in_stack_fffffffffffff768);
    do {
      in_stack_fffffffffffff768 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
                 (pointer)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (unsigned_long)in_stack_fffffffffffff738);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff738);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff778,in_stack_fffffffffffff770,
                 (size_t)in_stack_fffffffffffff768,
                 (const_string *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760));
      CService::CService((CService *)in_stack_fffffffffffff738);
      in_stack_fffffffffffff767 =
           i2p::sam::Session::Connect
                     ((Session *)CONCAT44(uVar4,in_stack_fffffffffffff848),to,conn_00,
                      (bool *)proxy_error_00);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
                 (bool)in_stack_fffffffffffff747);
      in_stack_fffffffffffff758 = (string *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
                 (pointer)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (unsigned_long)in_stack_fffffffffffff738);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff738);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
                 (pointer)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (unsigned_long)in_stack_fffffffffffff738);
      in_stack_fffffffffffff738 = (CThreadInterrupt *)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&stack0xfffffffffffff8c8,local_758,local_778,0xa9,CHECK,
                 CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff738);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff738);
      CService::~CService((CService *)in_stack_fffffffffffff738);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    i2p::Connection::~Connection((Connection *)in_stack_fffffffffffff738);
    DebugLogHelper::~DebugLogHelper((DebugLogHelper *)in_stack_fffffffffffff738);
    DebugLogHelper::~DebugLogHelper((DebugLogHelper *)in_stack_fffffffffffff738);
    i2p::sam::Session::~Session
              ((Session *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748));
    Proxy::~Proxy((Proxy *)in_stack_fffffffffffff738);
    CService::~CService((CService *)in_stack_fffffffffffff738);
    CThreadInterrupt::~CThreadInterrupt(in_stack_fffffffffffff738);
    __gnu_cxx::
    __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++((__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff738);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748));
  fs::path::~path((path *)in_stack_fffffffffffff738);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(damaged_private_key)
{
    CreateSock = [](int, int, int) {
        return std::make_unique<StaticContentsSock>("HELLO REPLY RESULT=OK VERSION=3.1\n"
                                                    "SESSION STATUS RESULT=OK DESTINATION=\n");
    };

    const auto i2p_private_key_file = m_args.GetDataDirNet() / "test_i2p_private_key_damaged";

    for (const auto& [file_contents, expected_error] : std::vector<std::tuple<std::string, std::string>>{
             {"", "The private key is too short (0 < 387)"},

             {"abcd", "The private key is too short (4 < 387)"},

             {std::string(386, '\0'), "The private key is too short (386 < 387)"},

             {std::string(385, '\0') + '\0' + '\1',
              "Certificate length (1) designates that the private key should be 388 bytes, but it is only "
              "387 bytes"},

             {std::string(385, '\0') + '\0' + '\5' + "abcd",
              "Certificate length (5) designates that the private key should be 392 bytes, but it is only "
              "391 bytes"}}) {
        BOOST_REQUIRE(WriteBinaryFile(i2p_private_key_file, file_contents));

        CThreadInterrupt interrupt;
        const CService addr{in6_addr(IN6ADDR_LOOPBACK_INIT), /*port=*/7656};
        const Proxy sam_proxy{addr, false};
        i2p::sam::Session session(i2p_private_key_file, sam_proxy, &interrupt);

        {
            ASSERT_DEBUG_LOG("Creating persistent SAM session");
            ASSERT_DEBUG_LOG(expected_error);

            i2p::Connection conn;
            bool proxy_error;
            BOOST_CHECK(!session.Connect(CService{}, conn, proxy_error));
        }
    }
}